

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_tests.cpp
# Opt level: O1

void (anonymous_namespace)::test_concat<true,5>(uint32_t sz)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  char *__function;
  leaf_node<int,_true> *plVar6;
  leaf_node<int,_true> *plVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long *plVar11;
  int iVar12;
  uint uVar13;
  vector<int,_true,_5> catted;
  vector<int,_true,_5> v2;
  vector<int,_true,_5> v1;
  ref<immutable::rrb<int,_true,_5>_> local_60;
  vector<int,_true,_5> local_58;
  vector<int,_true,_5> local_50;
  vector<int,_true,_5> local_48;
  uint local_3c;
  uint local_38;
  int local_34;
  
  immutable::vector<int,_true,_5>::vector(&local_50);
  immutable::vector<int,_true,_5>::vector(&local_58);
  if (sz != 0) {
    iVar12 = 2;
    uVar8 = 0;
    local_3c = sz;
    do {
      rand();
      immutable::vector<int,_true,_5>::push_back(&local_48,(value_type_conflict)&local_50);
      local_60 = local_50._impl.ptr;
      if (local_48._impl.ptr != (rrb<int,_true,_5> *)0x0) {
        LOCK();
        (((atomic<unsigned_int> *)((long)local_48._impl.ptr + 0x20))->
        super___atomic_base<unsigned_int>)._M_i =
             (((atomic<unsigned_int> *)((long)local_48._impl.ptr + 0x20))->
             super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      local_50._impl.ptr = local_48._impl.ptr;
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_60);
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_48._impl);
      rand();
      immutable::vector<int,_true,_5>::push_back(&local_48,(value_type_conflict)&local_58);
      local_60 = local_58._impl.ptr;
      if (local_48._impl.ptr != (rrb<int,_true,_5> *)0x0) {
        LOCK();
        (((atomic<unsigned_int> *)((long)local_48._impl.ptr + 0x20))->
        super___atomic_base<unsigned_int>)._M_i =
             (((atomic<unsigned_int> *)((long)local_48._impl.ptr + 0x20))->
             super___atomic_base<unsigned_int>)._M_i + 1;
        UNLOCK();
      }
      local_58._impl.ptr = local_48._impl.ptr;
      local_34 = iVar12;
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_60);
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_48._impl);
      immutable::operator+((immutable *)&local_60,&local_50,&local_58);
      local_38 = uVar8 + 1;
      uVar13 = 0;
      do {
        if (local_60.ptr == (rrb<int,_true,_5> *)0x0) goto LAB_00130ae3;
        if ((local_60.ptr)->cnt <= uVar13) goto LAB_00130afa;
        uVar3 = (local_60.ptr)->cnt - (local_60.ptr)->tail_len;
        uVar2 = uVar13 - uVar3;
        if (uVar3 <= uVar13) {
          plVar6 = ((local_60.ptr)->tail).ptr;
          if (plVar6 != (leaf_node<int,_true> *)0x0) goto LAB_00130921;
LAB_00130b19:
          __function = 
          "T *immutable::ref<immutable::rrb_details::leaf_node<int, true>>::operator->() const [T = immutable::rrb_details::leaf_node<int, true>]"
          ;
          goto LAB_00130b2e;
        }
        plVar6 = (leaf_node<int,_true> *)((local_60.ptr)->root).ptr;
        uVar2 = uVar13;
        for (uVar4 = (local_60.ptr)->shift; uVar4 != 0; uVar4 = uVar4 - 5) {
          uVar3 = uVar2 >> ((byte)uVar4 & 0x1f);
          if ((long *)plVar6->child == (long *)0x0) {
            plVar11 = (long *)((ulong)((uVar3 & 0x1f) << 3) + *(long *)(plVar6 + 1));
          }
          else {
            lVar1 = *(long *)plVar6->child;
            do {
              uVar5 = uVar3;
              uVar3 = uVar5 + 1;
            } while (*(uint *)(lVar1 + (ulong)uVar5 * 4) <= uVar2);
            if (uVar5 + 1 != 1) {
              uVar2 = uVar2 - *(int *)(lVar1 + (ulong)(uVar5 - 1) * 4);
            }
            plVar11 = (long *)((ulong)uVar5 * 8 + *(long *)(plVar6 + 1));
          }
          plVar6 = (leaf_node<int,_true> *)*plVar11;
        }
        uVar2 = uVar2 & 0x1f;
LAB_00130921:
        if (uVar8 < uVar13) {
          if (local_58._impl.ptr == (rrb<int,_true,_5> *)0x0) {
LAB_00130ae3:
            __function = 
            "T *immutable::ref<immutable::rrb<int>>::operator->() const [T = immutable::rrb<int>]";
LAB_00130b2e:
            __assert_fail("ptr != nullptr",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                          ,0x71a,__function);
          }
          uVar3 = uVar13 + ~uVar8;
          if (*(uint *)local_58._impl.ptr <= uVar3) {
LAB_00130afa:
            __assert_fail("index < rrb->cnt",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                          ,0x7c3,
                          "const T &immutable::rrb_nth(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = true, N = 5]"
                         );
          }
          uVar9 = *(uint *)local_58._impl.ptr - *(uint32_t *)((long)local_58._impl.ptr + 8);
          uVar5 = uVar3 - uVar9;
          if (uVar3 < uVar9) {
            plVar7 = (leaf_node<int,_true> *)
                     ((ref<immutable::rrb_details::tree_node<int,_true>_> *)
                     ((long)local_58._impl.ptr + 0x18))->ptr;
            for (uVar5 = *(uint32_t *)((long)local_58._impl.ptr + 4); uVar5 != 0; uVar5 = uVar5 - 5)
            {
              uVar9 = uVar3 >> ((byte)uVar5 & 0x1f);
              if ((long *)plVar7->child == (long *)0x0) {
                plVar11 = (long *)((ulong)((uVar9 & 0x1f) << 3) + *(long *)(plVar7 + 1));
              }
              else {
                lVar1 = *(long *)plVar7->child;
                do {
                  uVar10 = uVar9;
                  uVar9 = uVar10 + 1;
                } while (*(uint *)(lVar1 + (ulong)uVar10 * 4) <= uVar3);
                if (uVar10 + 1 != 1) {
                  uVar3 = uVar3 - *(int *)(lVar1 + (ulong)(uVar10 - 1) * 4);
                }
                plVar11 = (long *)((ulong)uVar10 * 8 + *(long *)(plVar7 + 1));
              }
              plVar7 = (leaf_node<int,_true> *)*plVar11;
            }
            uVar5 = uVar3 & 0x1f;
          }
          else {
            plVar7 = ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)
                     ((long)local_58._impl.ptr + 0x10))->ptr;
            if (plVar7 == (leaf_node<int,_true> *)0x0) goto LAB_00130b19;
          }
          TestEq<int,int>(plVar7->child[uVar5],plVar6->child[uVar2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                          ,0x123,
                          "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                         );
        }
        else {
          if (local_50._impl.ptr == (rrb<int,_true,_5> *)0x0) goto LAB_00130ae3;
          if (*(uint *)local_50._impl.ptr <= uVar13) goto LAB_00130afa;
          uVar5 = *(uint *)local_50._impl.ptr - *(uint32_t *)((long)local_50._impl.ptr + 8);
          uVar3 = uVar13 - uVar5;
          if (uVar13 < uVar5) {
            plVar7 = (leaf_node<int,_true> *)
                     ((ref<immutable::rrb_details::tree_node<int,_true>_> *)
                     ((long)local_50._impl.ptr + 0x18))->ptr;
            uVar3 = uVar13;
            for (uVar5 = *(uint32_t *)((long)local_50._impl.ptr + 4); uVar5 != 0; uVar5 = uVar5 - 5)
            {
              uVar9 = uVar3 >> ((byte)uVar5 & 0x1f);
              if ((long *)plVar7->child == (long *)0x0) {
                plVar11 = (long *)((ulong)((uVar9 & 0x1f) << 3) + *(long *)(plVar7 + 1));
              }
              else {
                lVar1 = *(long *)plVar7->child;
                do {
                  uVar10 = uVar9;
                  uVar9 = uVar10 + 1;
                } while (*(uint *)(lVar1 + (ulong)uVar10 * 4) <= uVar3);
                if (uVar10 + 1 != 1) {
                  uVar3 = uVar3 - *(int *)(lVar1 + (ulong)(uVar10 - 1) * 4);
                }
                plVar11 = (long *)((ulong)uVar10 * 8 + *(long *)(plVar7 + 1));
              }
              plVar7 = (leaf_node<int,_true> *)*plVar11;
            }
            uVar3 = uVar3 & 0x1f;
          }
          else {
            plVar7 = ((ref<immutable::rrb_details::leaf_node<int,_true>_> *)
                     ((long)local_50._impl.ptr + 0x10))->ptr;
            if (plVar7 == (leaf_node<int,_true> *)0x0) goto LAB_00130b19;
          }
          TestEq<int,int>(plVar7->child[uVar3],plVar6->child[uVar2],
                          "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/vector_tests.cpp"
                          ,0x11e,
                          "void (anonymous namespace)::test_concat(uint32_t) [atomic_ref_counting = true, N = 5]"
                         );
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != iVar12 + (uint)(iVar12 == 0));
      immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_60);
      iVar12 = local_34 + 2;
      uVar8 = local_38;
    } while (local_38 != local_3c);
  }
  immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_58._impl);
  immutable::ref<immutable::rrb<int,_true,_5>_>::~ref(&local_50._impl);
  return;
}

Assistant:

void test_concat(uint32_t sz = 2000)
    {
    immutable::vector<int, atomic_ref_counting, N> v1;
    immutable::vector<int, atomic_ref_counting, N> v2;
    for (uint32_t i = 0; i < sz; ++i)
      {
      v1 = v1.push_back((int)rand());
      v2 = v2.push_back((int)rand());

      immutable::vector<int, atomic_ref_counting, N> catted = v1 + v2;

      for (uint32_t j = 0; j < (i + 1) * 2; j++)
        {
        int val_cat = catted[j];
        if (j <= i)
          {
          int val1 = v1[j];
          TEST_EQ(val1, val_cat);
          }
        else
          {
          int val2 = v2[j - i - 1];
          TEST_EQ(val2, val_cat);
          }
        }
      }
    }